

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckOpcode2(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Type TVar1;
  Type expected2;
  Result RVar2;
  Address AVar3;
  char *desc;
  Opcode opcode_local;
  
  TVar1 = Opcode::GetParamType1(&opcode_local);
  AVar3 = Opcode::GetMemorySize(&opcode_local);
  if (((limits != (Limits *)0x0) && (AVar3 != 0)) && (limits->is_64 != false)) {
    TVar1.enum_ = I64;
  }
  expected2 = Opcode::GetParamType2(&opcode_local);
  desc = Opcode::GetName(&opcode_local);
  RVar2 = PopAndCheck2Types(this,TVar1,expected2,desc);
  TVar1 = Opcode::GetResultType(&opcode_local);
  PushType(this,TVar1);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode2(Opcode opcode, const Limits* limits) {
  Result result =
      PopAndCheck2Types(opcode.GetMemoryParam(opcode.GetParamType1(), limits,
                                              opcode.GetMemorySize() != 0),
                        opcode.GetParamType2(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}